

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::Tokenizer::NextWithComments
          (Tokenizer *this,string *prev_trailing_comments,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *detached_comments,string *next_leading_comments)

{
  bool bVar1;
  NextCommentStatus NVar2;
  string *psVar3;
  bool result;
  string local_a0;
  undefined1 local_70 [8];
  CommentCollector collector;
  string *next_leading_comments_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *detached_comments_local;
  string *prev_trailing_comments_local;
  Tokenizer *this_local;
  
  collector._56_8_ = next_leading_comments;
  anon_unknown_4::CommentCollector::CommentCollector
            ((CommentCollector *)local_70,prev_trailing_comments,detached_comments,
             next_leading_comments);
  if ((this->current_).type == TYPE_START) {
    bVar1 = TryConsume(this,-0x11);
    if ((!bVar1) ||
       ((bVar1 = TryConsume(this,-0x45), bVar1 && (bVar1 = TryConsume(this,-0x41), bVar1)))) {
      anon_unknown_4::CommentCollector::DetachFromPrev((CommentCollector *)local_70);
      goto switchD_0057a89f_default;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_a0,
               "Proto file starts with 0xEF but not UTF-8 BOM. Only UTF-8 is accepted for proto file."
               ,(allocator *)&result);
    AddError(this,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&result);
    this_local._7_1_ = false;
  }
  else {
    ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::WhitespaceNoNewline>(this);
    NVar2 = TryConsumeCommentStart(this);
    switch(NVar2) {
    case LINE_COMMENT:
      psVar3 = (anonymous_namespace)::CommentCollector::GetBufferForLineComment_abi_cxx11_
                         ((CommentCollector *)local_70);
      ConsumeLineComment(this,psVar3);
      anon_unknown_4::CommentCollector::Flush((CommentCollector *)local_70);
    default:
switchD_0057a89f_default:
      do {
        ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::WhitespaceNoNewline>(this);
        NVar2 = TryConsumeCommentStart(this);
        switch(NVar2) {
        case LINE_COMMENT:
          psVar3 = (anonymous_namespace)::CommentCollector::GetBufferForLineComment_abi_cxx11_
                             ((CommentCollector *)local_70);
          ConsumeLineComment(this,psVar3);
          break;
        case BLOCK_COMMENT:
          psVar3 = (anonymous_namespace)::CommentCollector::GetBufferForBlockComment_abi_cxx11_
                             ((CommentCollector *)local_70);
          ConsumeBlockComment(this,psVar3);
          ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::WhitespaceNoNewline>(this);
          TryConsume(this,'\n');
          break;
        case SLASH_NOT_COMMENT:
          goto switchD_0057a89f_caseD_2;
        case NO_COMMENT:
          bVar1 = TryConsume(this,'\n');
          if (!bVar1) {
            this_local._7_1_ = Next(this);
            if ((((!this_local._7_1_) ||
                 (bVar1 = std::operator==(&(this->current_).text,"}"), bVar1)) ||
                (bVar1 = std::operator==(&(this->current_).text,"]"), bVar1)) ||
               (bVar1 = std::operator==(&(this->current_).text,")"), bVar1)) {
              anon_unknown_4::CommentCollector::Flush((CommentCollector *)local_70);
            }
            goto LAB_0057aa48;
          }
          anon_unknown_4::CommentCollector::Flush((CommentCollector *)local_70);
          anon_unknown_4::CommentCollector::DetachFromPrev((CommentCollector *)local_70);
        }
      } while( true );
    case BLOCK_COMMENT:
      psVar3 = (anonymous_namespace)::CommentCollector::GetBufferForBlockComment_abi_cxx11_
                         ((CommentCollector *)local_70);
      ConsumeBlockComment(this,psVar3);
      ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::WhitespaceNoNewline>(this);
      bVar1 = TryConsume(this,'\n');
      if (bVar1) {
        anon_unknown_4::CommentCollector::Flush((CommentCollector *)local_70);
        goto switchD_0057a89f_default;
      }
      anon_unknown_4::CommentCollector::ClearBuffer((CommentCollector *)local_70);
      this_local._7_1_ = Next(this);
      break;
    case SLASH_NOT_COMMENT:
      this_local._7_1_ = true;
      break;
    case NO_COMMENT:
      bVar1 = TryConsume(this,'\n');
      if (bVar1) goto switchD_0057a89f_default;
      this_local._7_1_ = Next(this);
    }
  }
  goto LAB_0057aa48;
switchD_0057a89f_caseD_2:
  this_local._7_1_ = true;
LAB_0057aa48:
  anon_unknown_4::CommentCollector::~CommentCollector((CommentCollector *)local_70);
  return this_local._7_1_;
}

Assistant:

bool Tokenizer::NextWithComments(string* prev_trailing_comments,
                                 std::vector<string>* detached_comments,
                                 string* next_leading_comments) {
  CommentCollector collector(prev_trailing_comments, detached_comments,
                             next_leading_comments);

  if (current_.type == TYPE_START) {
    // Ignore unicode byte order mark(BOM) if it appears at the file
    // beginning. Only UTF-8 BOM (0xEF 0xBB 0xBF) is accepted.
    if (TryConsume((char)0xEF)) {
      if (!TryConsume((char)0xBB) || !TryConsume((char)0xBF)) {
        AddError("Proto file starts with 0xEF but not UTF-8 BOM. "
                 "Only UTF-8 is accepted for proto file.");
        return false;
      }
    }
    collector.DetachFromPrev();
  } else {
    // A comment appearing on the same line must be attached to the previous
    // declaration.
    ConsumeZeroOrMore<WhitespaceNoNewline>();
    switch (TryConsumeCommentStart()) {
      case LINE_COMMENT:
        ConsumeLineComment(collector.GetBufferForLineComment());

        // Don't allow comments on subsequent lines to be attached to a trailing
        // comment.
        collector.Flush();
        break;
      case BLOCK_COMMENT:
        ConsumeBlockComment(collector.GetBufferForBlockComment());

        ConsumeZeroOrMore<WhitespaceNoNewline>();
        if (!TryConsume('\n')) {
          // Oops, the next token is on the same line.  If we recorded a comment
          // we really have no idea which token it should be attached to.
          collector.ClearBuffer();
          return Next();
        }

        // Don't allow comments on subsequent lines to be attached to a trailing
        // comment.
        collector.Flush();
        break;
      case SLASH_NOT_COMMENT:
        return true;
      case NO_COMMENT:
        if (!TryConsume('\n')) {
          // The next token is on the same line.  There are no comments.
          return Next();
        }
        break;
    }
  }

  // OK, we are now on the line *after* the previous token.
  while (true) {
    ConsumeZeroOrMore<WhitespaceNoNewline>();

    switch (TryConsumeCommentStart()) {
      case LINE_COMMENT:
        ConsumeLineComment(collector.GetBufferForLineComment());
        break;
      case BLOCK_COMMENT:
        ConsumeBlockComment(collector.GetBufferForBlockComment());

        // Consume the rest of the line so that we don't interpret it as a
        // blank line the next time around the loop.
        ConsumeZeroOrMore<WhitespaceNoNewline>();
        TryConsume('\n');
        break;
      case SLASH_NOT_COMMENT:
        return true;
      case NO_COMMENT:
        if (TryConsume('\n')) {
          // Completely blank line.
          collector.Flush();
          collector.DetachFromPrev();
        } else {
          bool result = Next();
          if (!result ||
              current_.text == "}" ||
              current_.text == "]" ||
              current_.text == ")") {
            // It looks like we're at the end of a scope.  In this case it
            // makes no sense to attach a comment to the following token.
            collector.Flush();
          }
          return result;
        }
        break;
    }
  }
}